

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

float * __thiscall Mat::Getf(Mat *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  int local_20;
  int i;
  int size;
  float *fdata;
  Mat *this_local;
  
  iVar2 = this->n_rows_ * this->n_cols_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    pfVar4[local_20] = (float)this->v_[local_20];
  }
  return pfVar4;
}

Assistant:

float* Mat::Getf() {
	float * fdata;
	int size = n_rows_*n_cols_;
	fdata = new float[size];
	for(int i = 0; i < size; i++) 
		fdata[i] = (float) v_[i];
	return fdata;
}